

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLAbstractDoubleFloat.cpp
# Opt level: O3

int __thiscall
xercesc_4_0::XMLAbstractDoubleFloat::init(XMLAbstractDoubleFloat *this,EVP_PKEY_CTX *ctx)

{
  EVP_PKEY_CTX *pEVar1;
  short *psVar2;
  short *psVar3;
  XMLCh XVar4;
  MemoryManager *pMVar5;
  int iVar6;
  int extraout_EAX;
  undefined4 extraout_var;
  XMLCh *toDelete;
  long lVar7;
  XMLSize_t XVar8;
  char *pcVar9;
  NumberFormatException *pNVar10;
  size_t sVar11;
  XMLSize_t XVar12;
  ArrayJanitor<char16_t> janTmpName;
  char buffer [101];
  ArrayJanitor<char16_t> AStack_98;
  char *local_88;
  MemoryManager *local_80;
  undefined1 local_24;
  undefined4 extraout_var_00;
  
  if ((ctx == (EVP_PKEY_CTX *)0x0) || (*(short *)ctx == 0)) {
    pNVar10 = (NumberFormatException *)__cxa_allocate_exception(0x30);
    NumberFormatException::NumberFormatException
              (pNVar10,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLAbstractDoubleFloat.cpp"
               ,0x45,XMLNUM_emptyString,this->fMemoryManager);
    __cxa_throw(pNVar10,&NumberFormatException::typeinfo,XMLException::~XMLException);
  }
  sVar11 = 2;
  do {
    pEVar1 = ctx + sVar11;
    sVar11 = sVar11 + 2;
  } while (*(short *)pEVar1 != 0);
  iVar6 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,sVar11);
  memcpy((XMLCh *)CONCAT44(extraout_var,iVar6),ctx,sVar11);
  this->fRawData = (XMLCh *)CONCAT44(extraout_var,iVar6);
  sVar11 = 0;
  do {
    pEVar1 = ctx + sVar11;
    sVar11 = sVar11 + 2;
  } while (*(short *)pEVar1 != 0);
  iVar6 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,sVar11);
  toDelete = (XMLCh *)CONCAT44(extraout_var_00,iVar6);
  memcpy(toDelete,ctx,sVar11);
  ArrayJanitor<char16_t>::ArrayJanitor(&AStack_98,toDelete,this->fMemoryManager);
  XMLString::trim(toDelete);
  if (*toDelete == L'\0') {
    pNVar10 = (NumberFormatException *)__cxa_allocate_exception(0x30);
    NumberFormatException::NumberFormatException
              (pNVar10,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLAbstractDoubleFloat.cpp"
               ,0x4e,XMLNUM_emptyString,this->fMemoryManager);
    __cxa_throw(pNVar10,&NumberFormatException::typeinfo,XMLException::~XMLException);
  }
  normalizeZero(this,toDelete);
  if (toDelete == L"-INF") {
LAB_00247d5e:
    this->fType = NegINF;
    this->fSign = -1;
  }
  else {
    lVar7 = 0;
    do {
      psVar2 = (short *)((long)toDelete + lVar7);
      if (*psVar2 == 0) {
        if (*(short *)((long)&XMLUni::fgNegINFString + lVar7) == 0) goto LAB_00247d5e;
        break;
      }
      psVar3 = (short *)((long)&XMLUni::fgNegINFString + lVar7);
      lVar7 = lVar7 + 2;
    } while (*psVar2 == *psVar3);
    if (toDelete == L"INF") {
LAB_00247da7:
      this->fType = PosINF;
      this->fSign = 1;
    }
    else {
      lVar7 = 0;
      do {
        psVar2 = (short *)((long)toDelete + lVar7);
        if (*psVar2 == 0) {
          if (*(short *)((long)&XMLUni::fgPosINFString + lVar7) == 0) goto LAB_00247da7;
          break;
        }
        psVar3 = (short *)((long)&XMLUni::fgPosINFString + lVar7);
        lVar7 = lVar7 + 2;
      } while (*psVar2 == *psVar3);
      if (toDelete == L"NaN") {
LAB_00247e4b:
        this->fType = NaN;
        this->fSign = 1;
      }
      else {
        lVar7 = 0;
        do {
          psVar2 = (short *)((long)toDelete + lVar7);
          if (*psVar2 == 0) {
            if (*(short *)((long)&XMLUni::fgNaNString + lVar7) == 0) goto LAB_00247e4b;
            break;
          }
          psVar3 = (short *)((long)&XMLUni::fgNaNString + lVar7);
          lVar7 = lVar7 + 2;
        } while (*psVar2 == *psVar3);
        XVar4 = *toDelete;
        XVar12 = 0;
        if (XVar4 != L'\0') {
          do {
            if ((9 < (ushort)(XVar4 + L'￐')) &&
               ((0x3a < (ushort)XVar4 - 0x2b ||
                ((0x40000000400000dU >> ((ulong)((ushort)XVar4 - 0x2b) & 0x3f) & 1) == 0)))) {
              pNVar10 = (NumberFormatException *)__cxa_allocate_exception(0x30);
              NumberFormatException::NumberFormatException
                        (pNVar10,
                         "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLAbstractDoubleFloat.cpp"
                         ,0x7f,XMLNUM_Inv_chars,this->fMemoryManager);
              __cxa_throw(pNVar10,&NumberFormatException::typeinfo,XMLException::~XMLException);
            }
            XVar4 = toDelete[XVar12 + 1];
            XVar12 = XVar12 + 1;
          } while (XVar4 != L'\0');
          if (99 < XVar12) {
            pcVar9 = XMLString::transcode(toDelete,this->fMemoryManager);
            pMVar5 = this->fMemoryManager;
            local_88 = pcVar9;
            local_80 = pMVar5;
            (*(this->super_XMLNumber).super_XSerializable._vptr_XSerializable[8])(this,pcVar9);
            if (pcVar9 != (char *)0x0) {
              if (pMVar5 == (MemoryManager *)0x0) {
                operator_delete__(pcVar9);
              }
              else {
                (*pMVar5->_vptr_MemoryManager[4])(pMVar5,pcVar9);
              }
            }
            goto LAB_00247e59;
          }
        }
        XMLString::transcode(toDelete,(char *)&local_88,100,this->fMemoryManager);
        local_24 = 0;
        XVar8 = XMLString::stringLen((char *)&local_88);
        if (XVar8 != XVar12) {
          pNVar10 = (NumberFormatException *)__cxa_allocate_exception(0x30);
          NumberFormatException::NumberFormatException
                    (pNVar10,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLAbstractDoubleFloat.cpp"
                     ,0x9f,XMLNUM_Inv_chars,this->fMemoryManager);
          __cxa_throw(pNVar10,&NumberFormatException::typeinfo,XMLException::~XMLException);
        }
        (*(this->super_XMLNumber).super_XSerializable._vptr_XSerializable[8])(this,&local_88);
      }
    }
  }
LAB_00247e59:
  ArrayJanitor<char16_t>::~ArrayJanitor(&AStack_98);
  return extraout_EAX;
}

Assistant:

void XMLAbstractDoubleFloat::init(const XMLCh* const strValue)
{
    if ((!strValue) || (!*strValue))
        ThrowXMLwithMemMgr(NumberFormatException, XMLExcepts::XMLNUM_emptyString, fMemoryManager);

    fRawData = XMLString::replicate(strValue, fMemoryManager);   // preserve the raw data form

    XMLCh* tmpStrValue = XMLString::replicate(strValue, fMemoryManager);
    ArrayJanitor<XMLCh> janTmpName(tmpStrValue, fMemoryManager);
    XMLString::trim(tmpStrValue);

    if (!*tmpStrValue) 
        ThrowXMLwithMemMgr(NumberFormatException, XMLExcepts::XMLNUM_emptyString, fMemoryManager);

    normalizeZero(tmpStrValue);

    if (XMLString::equals(tmpStrValue, XMLUni::fgNegINFString) )
    {
        fType = NegINF;
        fSign = -1;
    }
    else if (XMLString::equals(tmpStrValue, XMLUni::fgPosINFString) )
    {
        fType = PosINF;
        fSign = 1;
    }
    else if (XMLString::equals(tmpStrValue, XMLUni::fgNaNString) )
    {
        fType = NaN;
        fSign = 1;
    }
    else
        //
        // Normal case
        //
    {
        // Use a stack-based buffer when possible.  Since all
        // valid doubles or floats will only contain ASCII
        // digits, a decimal point,  or the exponent character,
        // they will all be single byte characters, and this will
        // work.
        static const XMLSize_t maxStackSize = 100;

        XMLSize_t lenTempStrValue = 0;

        
        // Need to check that the string only contains valid schema characters
        // since the call to strtod may allow other values.  For example, AIX
        // allows "infinity" and "+INF"
        XMLCh curChar;
        while ((curChar = tmpStrValue[lenTempStrValue])!=0) {
            if (!((curChar >= chDigit_0 &&
                   curChar <= chDigit_9) ||
                  curChar == chPeriod  ||
                  curChar == chDash    ||
                  curChar == chPlus    ||
                  curChar == chLatin_E ||
                  curChar == chLatin_e)) {                
                ThrowXMLwithMemMgr(
                    NumberFormatException,
                    XMLExcepts::XMLNUM_Inv_chars,
                    getMemoryManager());
            }            
            lenTempStrValue++;
        }
       
        if (lenTempStrValue < maxStackSize)
        {
            char    buffer[maxStackSize + 1];

            XMLString::transcode(
                tmpStrValue,
                buffer,
                sizeof(buffer) - 1,
                getMemoryManager());

            // Do this for safety, because we've
            // no guarantee we didn't overrun the
            // capacity of the buffer when transcoding
            // a bogus value.
            buffer[maxStackSize] = '\0';

            // If they aren't the same length, then some
            // non-ASCII multibyte character was present.
            // This will only happen in the case where the
            // string has a bogus character, and it's long
            // enough to overrun this buffer, but we need
            // to check, even if it's unlikely to happen.
            if (XMLString::stringLen(buffer) != lenTempStrValue)
            {
                ThrowXMLwithMemMgr(
                    NumberFormatException,
                    XMLExcepts::XMLNUM_Inv_chars,
                    getMemoryManager());
            }

            checkBoundary(buffer);
        }
        else
        {
            char *nptr = XMLString::transcode(tmpStrValue, getMemoryManager());
            const ArrayJanitor<char> janStr(nptr, fMemoryManager);

            checkBoundary(nptr);
        }
    }

}